

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Vector3 Vector3Reflect(Vector3 v,Vector3 normal)

{
  Vector3 VVar1;
  float fVar2;
  float dotProduct;
  undefined4 local_48;
  undefined4 uStack_44;
  Vector3 normal_local;
  undefined4 local_28;
  undefined4 uStack_24;
  Vector3 v_local;
  undefined4 uStack_14;
  Vector3 result;
  
  fVar2 = Vector3DotProduct(v,normal);
  local_28 = v.x;
  local_48 = normal.x;
  uStack_24 = v.y;
  uStack_44 = normal.y;
  VVar1.z = v.z - (normal.z + normal.z) * fVar2;
  VVar1.x = local_28 - (local_48 + local_48) * fVar2;
  VVar1.y = uStack_24 - (uStack_44 + uStack_44) * fVar2;
  return VVar1;
}

Assistant:

RMDEF Vector3 Vector3Reflect(Vector3 v, Vector3 normal)
{
    // I is the original vector
    // N is the normal of the incident plane
    // R = I - (2*N*( DotProduct[ I,N] ))

    Vector3 result = { 0 };

    float dotProduct = Vector3DotProduct(v, normal);

    result.x = v.x - (2.0f*normal.x)*dotProduct;
    result.y = v.y - (2.0f*normal.y)*dotProduct;
    result.z = v.z - (2.0f*normal.z)*dotProduct;

    return result;
}